

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O3

bool __thiscall QTextStreamPrivate::getChar(QTextStreamPrivate *this,QChar *ch)

{
  long lVar1;
  long lVar2;
  QArrayData *data;
  qsizetype qVar3;
  qsizetype qVar4;
  void *pvVar5;
  void *pvVar6;
  DataPointer *pDVar7;
  Flags FVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  QString *pQVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  qsizetype *pqVar13;
  char16_t *pcVar14;
  
  pQVar12 = this->string;
  if ((pQVar12 == (QString *)0x0) || (this->stringOffset != (pQVar12->d).size)) {
    if ((this->device != (QIODevice *)0x0) && ((this->readBuffer).d.size == 0)) {
      bVar9 = fillReadBuffer(this,-1);
      if (!bVar9) goto LAB_002feeea;
      pQVar12 = this->string;
    }
    if (ch != (QChar *)0x0) {
      pDVar7 = &pQVar12->d;
      if (pQVar12 == (QString *)0x0) {
        pDVar7 = &(this->readBuffer).d;
      }
      pcVar14 = pDVar7->ptr;
      pqVar13 = &this->readBufferOffset;
      if (pQVar12 != (QString *)0x0) {
        pqVar13 = &this->stringOffset;
      }
      if (pcVar14 == (char16_t *)0x0) {
        pcVar14 = &QString::_empty;
      }
      ch->ucs = pcVar14[*pqVar13];
    }
    if (pQVar12 == (QString *)0x0) {
      lVar2 = this->readBufferOffset;
      lVar1 = lVar2 + 1;
      this->readBufferOffset = lVar1;
      pQVar12 = &this->readBuffer;
      if (lVar1 < (this->readBuffer).d.size) {
        bVar9 = true;
        if (0x3fff < lVar2) {
          iVar10 = QString::remove(pQVar12,(char *)0x0);
          QString::operator=(pQVar12,(QString *)CONCAT44(extraout_var,iVar10));
          this->readConverterSavedStateOffset =
               this->readConverterSavedStateOffset + this->readBufferOffset;
          this->readBufferOffset = 0;
        }
      }
      else {
        this->readBufferOffset = 0;
        if ((this->readBuffer).d.ptr != (char16_t *)0x0) {
          data = &((pQVar12->d).d)->super_QArrayData;
          (pQVar12->d).d = (Data *)0x0;
          (this->readBuffer).d.ptr = (char16_t *)0x0;
          (this->readBuffer).d.size = 0;
          if (data != (QArrayData *)0x0) {
            LOCK();
            (data->ref_)._q_value.super___atomic_base<int>._M_i =
                 (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(data,2,0x10);
            }
          }
        }
        iVar11 = (*(this->device->super_QObject)._vptr_QObject[0xf])();
        FVar8.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
        super_QFlagsStorage<QStringConverterBase::Flag>.i =
             (this->toUtf16).super_QStringConverter.state.flags.
             super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>;
        iVar10 = (this->toUtf16).super_QStringConverter.state.internalState;
        qVar3 = (this->toUtf16).super_QStringConverter.state.remainingChars;
        qVar4 = (this->toUtf16).super_QStringConverter.state.invalidChars;
        pvVar5 = (this->toUtf16).super_QStringConverter.state.field_4.d[0];
        pvVar6 = (this->toUtf16).super_QStringConverter.state.field_4.d[1];
        (this->savedToUtf16).super_QStringConverter.iface =
             (this->toUtf16).super_QStringConverter.iface;
        (this->savedToUtf16).super_QStringConverter.state.flags =
             (Flags)FVar8.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
                    super_QFlagsStorage<QStringConverterBase::Flag>.i;
        (this->savedToUtf16).super_QStringConverter.state.internalState = iVar10;
        (this->savedToUtf16).super_QStringConverter.state.remainingChars = qVar3;
        (this->savedToUtf16).super_QStringConverter.state.invalidChars = qVar4;
        (this->savedToUtf16).super_QStringConverter.state.field_4.d[0] = pvVar5;
        (this->savedToUtf16).super_QStringConverter.state.field_4.d[1] = pvVar6;
        (this->savedToUtf16).super_QStringConverter.state.clearFn =
             (this->toUtf16).super_QStringConverter.state.clearFn;
        this->readBufferStartDevicePos = CONCAT44(extraout_var_00,iVar11);
        this->readConverterSavedStateOffset = 0;
        bVar9 = true;
      }
    }
    else {
      lVar1 = this->stringOffset;
      this->stringOffset = lVar1 + 1;
      lVar2 = (pQVar12->d).size;
      bVar9 = true;
      if (lVar2 <= lVar1) {
        this->stringOffset = lVar2;
      }
    }
  }
  else {
LAB_002feeea:
    if (ch != (QChar *)0x0) {
      ch->ucs = L'\0';
    }
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

inline bool QTextStreamPrivate::getChar(QChar *ch)
{
    if ((string && stringOffset == string->size())
        || (device && readBuffer.isEmpty() && !fillReadBuffer())) {
        if (ch)
            *ch = QChar();
        return false;
    }
    if (ch)
        *ch = *readPtr();
    consume(1);
    return true;
}